

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

void get_top_weights<dense_parameters>
               (vw *all,int top_words_count,int topic,
               vector<feature,_std::allocator<feature>_> *output,dense_parameters *weights)

{
  undefined8 *puVar1;
  float fVar2;
  weight *pwVar3;
  uint64_t uVar4;
  float *pfVar5;
  ulong uVar6;
  pointer pfVar7;
  pointer pfVar8;
  pointer pfVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  bool bVar13;
  anon_class_1_0_00000001 cmp;
  _Vector_base<feature,_std::allocator<feature>_> local_78;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
  top_features;
  
  pfVar7 = (pointer)(1L << ((byte)all->num_bits & 0x3f));
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
  ::priority_queue(&top_features,&cmp,(vector<feature,_std::allocator<feature>_> *)&local_78);
  std::_Vector_base<feature,_std::allocator<feature>_>::~_Vector_base(&local_78);
  lVar10 = 1L << ((byte)weights->_stride_shift & 0x3f);
  pfVar9 = (pointer)(long)top_words_count;
  pfVar8 = pfVar7;
  if (pfVar9 < pfVar7) {
    pfVar8 = pfVar9;
  }
  pwVar3 = weights->_begin;
  lVar11 = 0;
  while (bVar13 = pfVar8 != (pointer)0x0, pfVar8 = (pointer)((long)&pfVar8[-1].weight_index + 7),
        bVar13) {
    local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)(lVar11 >> 2);
    local_78._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_78._M_impl.super__Vector_impl_data._M_start._4_4_,
                           *(undefined4 *)((long)pwVar3 + lVar11 + (long)topic * 4));
    std::
    priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
    ::push(&top_features,(value_type *)&local_78);
    lVar11 = lVar11 + lVar10 * 4;
  }
  pfVar5 = (float *)((long)pwVar3 + lVar11 + (long)topic * 4);
  for (; pfVar9 < pfVar7; pfVar9 = (pointer)((long)&pfVar9->x + 1)) {
    fVar2 = *pfVar5;
    if ((top_features.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
         super__Vector_impl_data._M_start)->x <= fVar2 &&
        fVar2 != (top_features.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
                  super__Vector_impl_data._M_start)->x) {
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
      ::pop(&top_features);
      local_78._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_78._M_impl.super__Vector_impl_data._M_start._4_4_,fVar2);
      local_78._M_impl.super__Vector_impl_data._M_finish = pfVar9;
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
      ::push(&top_features,(value_type *)&local_78);
    }
    pfVar5 = pfVar5 + lVar10;
  }
  std::vector<feature,_std::allocator<feature>_>::resize
            (output,(long)top_features.c.super__Vector_base<feature,_std::allocator<feature>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)top_features.c.super__Vector_base<feature,_std::allocator<feature>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 4);
  iVar12 = (int)((ulong)((long)top_features.c.super__Vector_base<feature,_std::allocator<feature>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)top_features.c.super__Vector_base<feature,_std::allocator<feature>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 4) + 1;
  uVar6 = (long)top_features.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)top_features.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
                super__Vector_impl_data._M_start & 0xffffffff0;
  while( true ) {
    iVar12 = iVar12 + -1;
    if (iVar12 < 1) break;
    uVar4 = (top_features.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
             super__Vector_impl_data._M_start)->weight_index;
    puVar1 = (undefined8 *)
             ((long)&(output->super__Vector_base<feature,_std::allocator<feature>_>)._M_impl.
                     super__Vector_impl_data._M_start[-1].x + uVar6);
    *puVar1 = *(undefined8 *)
               top_features.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
               super__Vector_impl_data._M_start;
    puVar1[1] = uVar4;
    std::
    priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
    ::pop(&top_features);
    uVar6 = uVar6 - 0x10;
  }
  std::_Vector_base<feature,_std::allocator<feature>_>::~_Vector_base
            ((_Vector_base<feature,_std::allocator<feature>_> *)&top_features);
  return;
}

Assistant:

void get_top_weights(vw *all, int top_words_count, int topic, std::vector<feature> &output, T &weights)
{
  uint64_t length = (uint64_t)1 << all->num_bits;

  // get top features for this topic
  auto cmp = [](feature left, feature right) { return left.x > right.x; };
  std::priority_queue<feature, std::vector<feature>, decltype(cmp)> top_features(cmp);
  typename T::iterator iter = weights.begin();

  for (uint64_t i = 0; i < min(top_words_count, length); i++, ++iter)
    top_features.push({(&(*iter))[topic], iter.index()});

  for (uint64_t i = top_words_count; i < length; i++, ++iter)
  {
    weight v = (&(*iter))[topic];
    if (v > top_features.top().x)
    {
      top_features.pop();
      top_features.push({v, i});
    }
  }

  // extract idx and sort descending
  output.resize(top_features.size());
  for (int i = (int)top_features.size() - 1; i >= 0; i--)
  {
    output[i] = top_features.top();
    top_features.pop();
  }
}